

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLURL::cleanUp(XMLURL *this)

{
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fQuery);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURLText);
  this->fPassword = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fFragment = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fQuery = (XMLCh *)0x0;
  this->fUser = (XMLCh *)0x0;
  this->fURLText = (XMLCh *)0x0;
  this->fPortNum = 0;
  this->fProtocol = Unknown;
  this->fHasInvalidChar = false;
  return;
}

Assistant:

void XMLURL::cleanUp()
{
    fMemoryManager->deallocate(fFragment);//delete [] fFragment;
    fMemoryManager->deallocate(fHost);//delete [] fHost;
    fMemoryManager->deallocate(fPassword);//delete [] fPassword;
    fMemoryManager->deallocate(fPath);//delete [] fPath;
    fMemoryManager->deallocate(fQuery);//delete [] fQuery;
    fMemoryManager->deallocate(fUser);//delete [] fUser;
    fMemoryManager->deallocate(fURLText);//delete [] fURLText;

    fFragment = 0;
    fHost = 0;
    fPassword = 0;
    fPath = 0;
    fQuery = 0;
    fUser = 0;
    fURLText = 0;

    fProtocol = Unknown;
    fPortNum = 0;
    fHasInvalidChar = false;
}